

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

void henson::Serialization<henson::Scheduler::Job>::load(BinaryBuffer *bb,Job *j)

{
  BinaryBuffer *in_RSI;
  MemoryBuffer *in_stack_ffffffffffffffe8;
  
  load<unsigned_long>(in_RSI,(unsigned_long *)in_stack_ffffffffffffffe8);
  load<std::__cxx11::string>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffe8);
  load<std::__cxx11::string>
            (in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_ffffffffffffffe8);
  load<henson::MemoryBuffer>(in_RSI,in_stack_ffffffffffffffe8);
  load<std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>
            (in_RSI,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)in_stack_ffffffffffffffe8);
  load<unsigned_long>(in_RSI,(unsigned_long *)in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Scheduler::Job& j)
    {
        henson::load(bb, j.id);
        henson::load(bb, j.name);
        henson::load(bb, j.function);
        henson::load(bb, j.arg);
        henson::load(bb, j.groups);
        henson::load(bb, j.size);
    }